

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O0

operator_type_t
pi_template_lookup_symbol
          (pi_template_generator_t *ptg_context,char *begin_tag,dino_string_ptr result_buffer,
          _Bool *response_result)

{
  dino_intmap_t *map;
  _Bool _Var1;
  dino_string_ptr string_ptr;
  char *pcVar2;
  dino_string_ptr local_48;
  dino_string_ptr second_symbol;
  dino_string_ptr first_symbol;
  char *end_tag;
  _Bool *p_Stack_28;
  operator_type_t operator_type;
  _Bool *response_result_local;
  dino_string_ptr result_buffer_local;
  char *begin_tag_local;
  pi_template_generator_t *ptg_context_local;
  
  p_Stack_28 = response_result;
  response_result_local = (_Bool *)result_buffer;
  result_buffer_local = (dino_string_ptr)begin_tag;
  begin_tag_local = (char *)ptg_context;
  if ((result_buffer == (dino_string_ptr)0x0) || (response_result == (_Bool *)0x0)) {
    log_message(1,"pi_template_lookup_symbol",
                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                ,0xc3,"Assert Fired");
  }
  if ((*(char *)&result_buffer_local->c_string != '<') ||
     (*(char *)((long)&result_buffer_local->c_string + 1) != '%')) {
    log_message(1,"pi_template_lookup_symbol",
                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                ,0xc4,"Assert Fired");
  }
  if (response_result_local != (_Bool *)0x0) {
    dino_string_reset((dino_string_ptr)response_result_local);
  }
  if (p_Stack_28 != (_Bool *)0x0) {
    *p_Stack_28 = false;
  }
  end_tag._4_4_ = operator_type_invalid;
  if ((*(char *)&result_buffer_local->c_string == '<') &&
     (*(char *)((long)&result_buffer_local->c_string + 1) == '%')) {
    first_symbol = (dino_string_ptr)0x0;
    string_ptr = pi_template_get_symbol
                           ((char *)((long)&result_buffer_local->c_string + 2),
                            (char **)&first_symbol);
    map = *(dino_intmap_t **)(begin_tag_local + 0x18);
    pcVar2 = dino_string_c_ptr(string_ptr);
    end_tag._4_4_ = intmap_get_value(map,pcVar2);
    local_48 = (dino_string_ptr)0x0;
    switch(end_tag._4_4_) {
    case operator_type_invalid:
    default:
      pcVar2 = dino_string_c_ptr(string_ptr);
      log_message(2,"pi_template_lookup_symbol",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino_template_generator.c"
                  ,0xf6,"Unknown symbol or operator: %s",pcVar2);
      break;
    case operator_type_variable:
      _Var1 = pi_template_resolve_symbol
                        ((pi_template_generator_t *)begin_tag_local,string_ptr,
                         (dino_string_ptr)response_result_local);
      if (!_Var1) {
        end_tag._4_4_ = operator_type_invalid;
      }
      break;
    case operator_type_If:
      local_48 = pi_template_get_symbol((char *)first_symbol,(char **)&first_symbol);
      _Var1 = pi_template_test_symbol
                        ((pi_template_generator_t *)begin_tag_local,local_48,p_Stack_28);
      if (!_Var1) {
        end_tag._4_4_ = operator_type_invalid;
      }
      break;
    case operator_type_Else:
    case operator_type_EndIf:
      break;
    case operator_type_output:
      local_48 = pi_template_get_symbol((char *)first_symbol,(char **)&first_symbol);
      _Var1 = pi_template_resolve_symbol
                        ((pi_template_generator_t *)begin_tag_local,local_48,
                         (dino_string_ptr)response_result_local);
      if (!_Var1) {
        end_tag._4_4_ = operator_type_invalid;
      }
    }
    dino_string_delete(string_ptr,true);
    dino_string_delete(local_48,true);
  }
  return end_tag._4_4_;
}

Assistant:

operator_type_t pi_template_lookup_symbol(pi_template_generator_t *ptg_context,
                                          const char *begin_tag,
                                          dino_string_ptr result_buffer,
                                          bool *response_result) {
    ASSERT(result_buffer != NULL && response_result != NULL);
    ASSERT(*begin_tag == '<' && *(begin_tag + 1) == '%');

    if (result_buffer) {
        dino_string_reset(result_buffer);
    }

    if (response_result) {
        *response_result = false;
    }

    operator_type_t operator_type = operator_type_invalid;

    if (*begin_tag == '<' && *(begin_tag + 1) == '%') {
        //  Move past the '<%' tag marker and any leading white spaces.
        //
        char *end_tag = NULL;
        dino_string_ptr first_symbol = pi_template_get_symbol(begin_tag + 2, &end_tag);

        operator_type = (operator_type_t) intmap_get_value(ptg_context->symbol_map,
                                                           dino_string_c_ptr(first_symbol));

        dino_string_ptr second_symbol = NULL;

        switch (operator_type) {
            case operator_type_If:
                second_symbol = pi_template_get_symbol(end_tag, &end_tag);
                if (!pi_template_test_symbol(ptg_context, second_symbol, response_result)) {
                    operator_type = operator_type_invalid;
                }
                break;

            case operator_type_Else:
            case operator_type_EndIf:
                break;

            case operator_type_output:
                second_symbol = pi_template_get_symbol(end_tag, &end_tag);
                if (!pi_template_resolve_symbol(ptg_context, second_symbol, result_buffer)) {
                    operator_type = operator_type_invalid;
                }
                break;

            case operator_type_variable:
                if (!pi_template_resolve_symbol(ptg_context, first_symbol, result_buffer)) {
                    operator_type = operator_type_invalid;
                }
                break;

            case operator_type_invalid:
            default:
                ERROR_LOG("Unknown symbol or operator: %s", dino_string_c_ptr(first_symbol));
                break;

        }

        dino_string_delete(first_symbol, true);
        dino_string_delete(second_symbol, true);
    }

    return operator_type;
}